

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

int mspace_trim(mspace msp,size_t pad)

{
  int iVar1;
  mstate ms;
  int result;
  size_t pad_local;
  mspace msp_local;
  
  iVar1 = sys_trim((mstate)msp,pad);
  return iVar1;
}

Assistant:

int mspace_trim(mspace msp, size_t pad) {
  int result = 0;
  mstate ms = (mstate)msp;
  if (ok_magic(ms)) {
    if (!PREACTION(ms)) {
      result = sys_trim(ms, pad);
      POSTACTION(ms);
    }
  }
  else {
    USAGE_ERROR_ACTION(ms,ms);
  }
  return result;
}